

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsers.h
# Opt level: O2

Result<wasm::Ok> *
wasm::WATParser::makeBrOnCast<wasm::WATParser::ParseDefsCtx>
          (Result<wasm::Ok> *__return_storage_ptr__,ParseDefsCtx *ctx,Index pos,
          vector<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
          *annotations,bool onFail)

{
  undefined1 local_f8 [8];
  Result<unsigned_int> label;
  undefined1 local_b0 [8];
  Result<wasm::Type> _val_2;
  undefined1 local_80 [8];
  Result<wasm::Type> in;
  Result<wasm::Type> out;
  
  _val_2.val.super__Variant_base<wasm::Type,_wasm::Err>.
  super__Move_assign_alias<wasm::Type,_wasm::Err>.super__Copy_assign_alias<wasm::Type,_wasm::Err>.
  super__Move_ctor_alias<wasm::Type,_wasm::Err>.super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
  super__Variant_storage_alias<wasm::Type,_wasm::Err>._32_8_ = annotations;
  labelidx<wasm::WATParser::ParseDefsCtx>((Result<unsigned_int> *)local_f8,ctx,false);
  std::__detail::__variant::_Copy_ctor_base<false,_unsigned_int,_wasm::Err>::_Copy_ctor_base
            ((_Copy_ctor_base<false,_unsigned_int,_wasm::Err> *)local_80,
             (_Copy_ctor_base<false,_unsigned_int,_wasm::Err> *)local_f8);
  if (in.val.super__Variant_base<wasm::Type,_wasm::Err>.
      super__Move_assign_alias<wasm::Type,_wasm::Err>.
      super__Copy_assign_alias<wasm::Type,_wasm::Err>.super__Move_ctor_alias<wasm::Type,_wasm::Err>.
      super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
      super__Variant_storage_alias<wasm::Type,_wasm::Err>._M_u._24_1_ == '\x01') {
    std::__cxx11::string::string
              ((string *)
               ((long)&in.val.super__Variant_base<wasm::Type,_wasm::Err>.
                       super__Move_assign_alias<wasm::Type,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Type,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Type,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Type,_wasm::Err> + 0x20),(string *)local_80);
    std::__detail::__variant::_Variant_storage<false,wasm::Ok,wasm::Err>::
    _Variant_storage<1ul,wasm::Err>
              ((_Variant_storage<false,wasm::Ok,wasm::Err> *)__return_storage_ptr__,
               (__index_type *)
               ((long)&in.val.super__Variant_base<wasm::Type,_wasm::Err>.
                       super__Move_assign_alias<wasm::Type,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Type,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Type,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Type,_wasm::Err> + 0x20));
    std::__cxx11::string::~string
              ((string *)
               ((long)&in.val.super__Variant_base<wasm::Type,_wasm::Err>.
                       super__Move_assign_alias<wasm::Type,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Type,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Type,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Type,_wasm::Err> + 0x20));
    std::__detail::__variant::_Variant_storage<false,_unsigned_int,_wasm::Err>::~_Variant_storage
              ((_Variant_storage<false,_unsigned_int,_wasm::Err> *)local_80);
  }
  else {
    std::__detail::__variant::_Variant_storage<false,_unsigned_int,_wasm::Err>::~_Variant_storage
              ((_Variant_storage<false,_unsigned_int,_wasm::Err> *)local_80);
    reftype<wasm::WATParser::ParseDefsCtx>((Result<wasm::Type> *)local_80,ctx);
    std::__detail::__variant::_Copy_ctor_base<false,_wasm::Type,_wasm::Err>::_Copy_ctor_base
              ((_Copy_ctor_base<false,_wasm::Type,_wasm::Err> *)
               ((long)&in.val.super__Variant_base<wasm::Type,_wasm::Err>.
                       super__Move_assign_alias<wasm::Type,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Type,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Type,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Type,_wasm::Err> + 0x20),
               (_Copy_ctor_base<false,_wasm::Type,_wasm::Err> *)local_80);
    if (out.val.super__Variant_base<wasm::Type,_wasm::Err>.
        super__Move_assign_alias<wasm::Type,_wasm::Err>.
        super__Copy_assign_alias<wasm::Type,_wasm::Err>.
        super__Move_ctor_alias<wasm::Type,_wasm::Err>.super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
        super__Variant_storage_alias<wasm::Type,_wasm::Err>._M_u._24_1_ == '\x01') {
      std::__cxx11::string::string
                ((string *)local_b0,
                 (string *)
                 ((long)&in.val.super__Variant_base<wasm::Type,_wasm::Err>.
                         super__Move_assign_alias<wasm::Type,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Type,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Type,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Type,_wasm::Err> + 0x20));
      std::__detail::__variant::_Variant_storage<false,wasm::Ok,wasm::Err>::
      _Variant_storage<1ul,wasm::Err>
                ((_Variant_storage<false,wasm::Ok,wasm::Err> *)__return_storage_ptr__,local_b0);
      std::__cxx11::string::~string((string *)local_b0);
    }
    else {
      std::__detail::__variant::_Variant_storage<false,_wasm::Type,_wasm::Err>::~_Variant_storage
                ((_Variant_storage<false,_wasm::Type,_wasm::Err> *)
                 ((long)&in.val.super__Variant_base<wasm::Type,_wasm::Err>.
                         super__Move_assign_alias<wasm::Type,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Type,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Type,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Type,_wasm::Err> + 0x20));
      reftype<wasm::WATParser::ParseDefsCtx>
                ((Result<wasm::Type> *)
                 ((long)&in.val.super__Variant_base<wasm::Type,_wasm::Err>.
                         super__Move_assign_alias<wasm::Type,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Type,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Type,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Type,_wasm::Err> + 0x20),ctx);
      std::__detail::__variant::_Copy_ctor_base<false,_wasm::Type,_wasm::Err>::_Copy_ctor_base
                ((_Copy_ctor_base<false,_wasm::Type,_wasm::Err> *)local_b0,
                 (_Copy_ctor_base<false,_wasm::Type,_wasm::Err> *)
                 ((long)&in.val.super__Variant_base<wasm::Type,_wasm::Err>.
                         super__Move_assign_alias<wasm::Type,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Type,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Type,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Type,_wasm::Err> + 0x20));
      if (_val_2.val.super__Variant_base<wasm::Type,_wasm::Err>.
          super__Move_assign_alias<wasm::Type,_wasm::Err>.
          super__Copy_assign_alias<wasm::Type,_wasm::Err>.
          super__Move_ctor_alias<wasm::Type,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
          super__Variant_storage_alias<wasm::Type,_wasm::Err>._M_u._24_1_ == '\x01') {
        std::__cxx11::string::string
                  ((string *)
                   ((long)&label.val.super__Variant_base<unsigned_int,_wasm::Err>.
                           super__Move_assign_alias<unsigned_int,_wasm::Err>.
                           super__Copy_assign_alias<unsigned_int,_wasm::Err>.
                           super__Move_ctor_alias<unsigned_int,_wasm::Err>.
                           super__Copy_ctor_alias<unsigned_int,_wasm::Err> + 0x20),
                   (string *)local_b0);
        std::__detail::__variant::_Variant_storage<false,wasm::Ok,wasm::Err>::
        _Variant_storage<1ul,wasm::Err>
                  ((_Variant_storage<false,wasm::Ok,wasm::Err> *)__return_storage_ptr__,
                   (__index_type *)
                   ((long)&label.val.super__Variant_base<unsigned_int,_wasm::Err>.
                           super__Move_assign_alias<unsigned_int,_wasm::Err>.
                           super__Copy_assign_alias<unsigned_int,_wasm::Err>.
                           super__Move_ctor_alias<unsigned_int,_wasm::Err>.
                           super__Copy_ctor_alias<unsigned_int,_wasm::Err> + 0x20));
        std::__cxx11::string::~string
                  ((string *)
                   ((long)&label.val.super__Variant_base<unsigned_int,_wasm::Err>.
                           super__Move_assign_alias<unsigned_int,_wasm::Err>.
                           super__Copy_assign_alias<unsigned_int,_wasm::Err>.
                           super__Move_ctor_alias<unsigned_int,_wasm::Err>.
                           super__Copy_ctor_alias<unsigned_int,_wasm::Err> + 0x20));
        std::__detail::__variant::_Variant_storage<false,_wasm::Type,_wasm::Err>::~_Variant_storage
                  ((_Variant_storage<false,_wasm::Type,_wasm::Err> *)local_b0);
      }
      else {
        std::__detail::__variant::_Variant_storage<false,_wasm::Type,_wasm::Err>::~_Variant_storage
                  ((_Variant_storage<false,_wasm::Type,_wasm::Err> *)local_b0);
        ParseDefsCtx::makeBrOn
                  (__return_storage_ptr__,ctx,pos,
                   (vector<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
                    *)_val_2.val.super__Variant_base<wasm::Type,_wasm::Err>.
                      super__Move_assign_alias<wasm::Type,_wasm::Err>.
                      super__Copy_assign_alias<wasm::Type,_wasm::Err>.
                      super__Move_ctor_alias<wasm::Type,_wasm::Err>.
                      super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
                      super__Variant_storage_alias<wasm::Type,_wasm::Err>._32_8_,local_f8._0_4_,
                   onFail | BrOnCast,(Type)local_80,
                   (Type)in.val.super__Variant_base<wasm::Type,_wasm::Err>.
                         super__Move_assign_alias<wasm::Type,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Type,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Type,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
                         super__Variant_storage_alias<wasm::Type,_wasm::Err>._32_8_);
      }
    }
    std::__detail::__variant::_Variant_storage<false,_wasm::Type,_wasm::Err>::~_Variant_storage
              ((_Variant_storage<false,_wasm::Type,_wasm::Err> *)
               ((long)&in.val.super__Variant_base<wasm::Type,_wasm::Err>.
                       super__Move_assign_alias<wasm::Type,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Type,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Type,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Type,_wasm::Err> + 0x20));
    std::__detail::__variant::_Variant_storage<false,_wasm::Type,_wasm::Err>::~_Variant_storage
              ((_Variant_storage<false,_wasm::Type,_wasm::Err> *)local_80);
  }
  std::__detail::__variant::_Variant_storage<false,_unsigned_int,_wasm::Err>::~_Variant_storage
            ((_Variant_storage<false,_unsigned_int,_wasm::Err> *)local_f8);
  return __return_storage_ptr__;
}

Assistant:

Result<> makeBrOnCast(Ctx& ctx,
                      Index pos,
                      const std::vector<Annotation>& annotations,
                      bool onFail) {
  auto label = labelidx(ctx);
  CHECK_ERR(label);
  auto in = reftype(ctx);
  CHECK_ERR(in);
  auto out = reftype(ctx);
  CHECK_ERR(out);
  return ctx.makeBrOn(
    pos, annotations, *label, onFail ? BrOnCastFail : BrOnCast, *in, *out);
}